

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QString,QConfFile*>::emplace<QConfFile*const&>
          (QHash<QString,QConfFile*> *this,QString *key,QConfFile **args)

{
  Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *pDVar1;
  QConfFile *pQVar2;
  long in_FS_OFFSET;
  piter pVar3;
  QConfFile *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = *(QConfFile **)this;
  if (pQVar2 == (QConfFile *)0x0) {
    local_28 = (QConfFile *)0x0;
LAB_004320bf:
    pQVar2 = (QConfFile *)0x0;
LAB_004320e0:
    pDVar1 = QHashPrivate::Data<QHashPrivate::Node<QString,_QConfFile_*>_>::detached
                       ((Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *)pQVar2);
    *(Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> **)this = pDVar1;
LAB_004320e8:
    pVar3 = (piter)emplace_helper<QConfFile*const&>(this,key,args);
    QHash<QString,_QConfFile_*>::~QHash((QHash<QString,_QConfFile_*> *)&local_28);
  }
  else {
    if (1 < *(uint *)&(pQVar2->name).d.d) {
      local_28 = pQVar2;
      if (*(int *)&(pQVar2->name).d.d != -1) {
        LOCK();
        *(int *)&(pQVar2->name).d.d = *(int *)&(pQVar2->name).d.d + 1;
        UNLOCK();
        pQVar2 = *(QConfFile **)this;
        if (pQVar2 == (QConfFile *)0x0) goto LAB_004320bf;
      }
      if (1 < *(uint *)&(pQVar2->name).d.d) goto LAB_004320e0;
      goto LAB_004320e8;
    }
    if ((pQVar2->name).d.ptr < (char16_t *)((ulong)(pQVar2->name).d.size >> 1)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar3 = (piter)emplace_helper<QConfFile*const&>(this,key,args);
        return (iterator)pVar3;
      }
      goto LAB_00432167;
    }
    local_28 = *args;
    pVar3 = (piter)emplace_helper<QConfFile*>(this,key,&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
LAB_00432167:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }